

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel.cpp
# Opt level: O2

bool __thiscall QFileSystemModel::event(QFileSystemModel *this,QEvent *event)

{
  long lVar1;
  undefined1 uVar2;
  QAbstractFileIconProvider *iconProvider;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(short *)(event + 8) == 0x59) {
    lVar1 = *(long *)&this->field_0x8;
    iconProvider = QFileInfoGatherer::iconProvider(*(QFileInfoGatherer **)(lVar1 + 0xe0));
    local_38.d = (Data *)0x0;
    local_38.ptr = (char16_t *)0x0;
    local_38.size = 0;
    QFileSystemModelPrivate::QFileSystemNode::retranslateStrings
              ((QFileSystemNode *)(lVar1 + 0x138),iconProvider,(QString *)&local_38);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      return true;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    uVar2 = QObject::event((QEvent *)this);
    return (bool)uVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QFileSystemModel::event(QEvent *event)
{
#if QT_CONFIG(filesystemwatcher)
    Q_D(QFileSystemModel);
    if (event->type() == QEvent::LanguageChange) {
        d->root.retranslateStrings(d->fileInfoGatherer->iconProvider(), QString());
        return true;
    }
#endif
    return QAbstractItemModel::event(event);
}